

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int cmcmd::HashSumFile(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,Algo algo)

{
  char *pcVar1;
  bool bVar2;
  pointer pbVar3;
  ostream *poVar4;
  pointer pbVar5;
  long lVar6;
  ulong uVar7;
  int local_84;
  allocator local_7d;
  Algo local_7c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  string value;
  string local_50;
  
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar5 - (long)pbVar3) < 0x41) {
    local_84 = -1;
  }
  else {
    local_84 = 0;
    lVar6 = 0x40;
    local_7c = algo;
    local_78 = args;
    for (uVar7 = 2; uVar7 < (ulong)((long)pbVar5 - (long)pbVar3 >> 5); uVar7 = uVar7 + 1) {
      pcVar1 = *(char **)((long)&(pbVar3->_M_dataplus)._M_p + lVar6);
      std::__cxx11::string::string((string *)&value,pcVar1,(allocator *)&local_50);
      bVar2 = cmsys::SystemTools::FileIsDirectory(&value);
      std::__cxx11::string::~string((string *)&value);
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error: ");
        poVar4 = std::operator<<(poVar4,pcVar1);
        poVar4 = std::operator<<(poVar4," is a directory");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_84 = local_84 + 1;
      }
      else {
        std::__cxx11::string::string((string *)&local_50,pcVar1,&local_7d);
        cmSystemTools::ComputeFileHash(&value,&local_50,local_7c);
        std::__cxx11::string::~string((string *)&local_50);
        if (value._M_string_length == 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,pcVar1);
          poVar4 = std::operator<<(poVar4,": No such file or directory");
          std::endl<char,std::char_traits<char>>(poVar4);
          local_84 = local_84 + 1;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&value);
          poVar4 = std::operator<<(poVar4,"  ");
          poVar4 = std::operator<<(poVar4,pcVar1);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        std::__cxx11::string::~string((string *)&value);
      }
      pbVar3 = (local_78->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (local_78->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + 0x20;
    }
  }
  return local_84;
}

Assistant:

int cmcmd::HashSumFile(std::vector<std::string>& args, cmCryptoHash::Algo algo)
{
  if (args.size() < 3) {
    return -1;
  }
  int retval = 0;

  for (std::string::size_type cc = 2; cc < args.size(); cc++) {
    const char* filename = args[cc].c_str();
    // Cannot compute sum of a directory
    if (cmSystemTools::FileIsDirectory(filename)) {
      std::cerr << "Error: " << filename << " is a directory" << std::endl;
      retval++;
    } else {
      std::string value = cmSystemTools::ComputeFileHash(filename, algo);
      if (value.empty()) {
        // To mimic "md5sum/shasum" behavior in a shell:
        std::cerr << filename << ": No such file or directory" << std::endl;
        retval++;
      } else {
        std::cout << value << "  " << filename << std::endl;
      }
    }
  }
  return retval;
}